

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::parse_range_header(string *s,Ranges *ranges)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  anon_class_24_3_3716034d *__f;
  function<void_(const_char_*,_const_char_*)> *this;
  ulong in_RDI;
  bool all_valid_ranges;
  size_t len;
  size_t pos;
  anon_class_1_0_00000001 is_valid;
  byte local_99;
  undefined7 in_stack_ffffffffffffffb8;
  byte bVar5;
  char d;
  char *e;
  char *in_stack_ffffffffffffffd0;
  
  uVar3 = ::std::__cxx11::string::size();
  if ((7 < uVar3) && (iVar2 = ::std::__cxx11::string::compare(in_RDI,0,(char *)0x6), iVar2 == 0)) {
    e = (char *)0x6;
    lVar4 = ::std::__cxx11::string::size();
    d = (char)((ulong)(lVar4 + -6) >> 0x38);
    bVar5 = 1;
    __f = (anon_class_24_3_3716034d *)::std::__cxx11::string::operator[](in_RDI);
    this = (function<void_(const_char_*,_const_char_*)> *)::std::__cxx11::string::operator[](in_RDI)
    ;
    ::std::function<void(char_const*,char_const*)>::
    function<httplib::detail::parse_range_header(std::__cxx11::string_const&,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>&)::_lambda(char_const*,char_const*)_1_,void>
              (this,__f);
    split(in_stack_ffffffffffffffd0,e,d,
          (function<void_(const_char_*,_const_char_*)> *)CONCAT17(bVar5,in_stack_ffffffffffffffb8));
    std::function<void_(const_char_*,_const_char_*)>::~function
              ((function<void_(const_char_*,_const_char_*)> *)0x21c21e);
    local_99 = 0;
    if ((bVar5 & 1) != 0) {
      bVar1 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::empty
                        ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                         this);
      local_99 = bVar1 ^ 0xff;
    }
    return (bool)(local_99 & 1);
  }
  return false;
}

Assistant:

inline bool parse_range_header(const std::string &s, Ranges &ranges) try {
#endif
  auto is_valid = [](const std::string &str) {
    return std::all_of(str.cbegin(), str.cend(),
                       [](unsigned char c) { return std::isdigit(c); });
  };

  if (s.size() > 7 && s.compare(0, 6, "bytes=") == 0) {
    const auto pos = static_cast<size_t>(6);
    const auto len = static_cast<size_t>(s.size() - 6);
    auto all_valid_ranges = true;
    split(&s[pos], &s[pos + len], ',', [&](const char *b, const char *e) {
      if (!all_valid_ranges) { return; }

      const auto it = std::find(b, e, '-');
      if (it == e) {
        all_valid_ranges = false;
        return;
      }

      const auto lhs = std::string(b, it);
      const auto rhs = std::string(it + 1, e);
      if (!is_valid(lhs) || !is_valid(rhs)) {
        all_valid_ranges = false;
        return;
      }

      const auto first =
          static_cast<ssize_t>(lhs.empty() ? -1 : std::stoll(lhs));
      const auto last =
          static_cast<ssize_t>(rhs.empty() ? -1 : std::stoll(rhs));
      if ((first == -1 && last == -1) ||
          (first != -1 && last != -1 && first > last)) {
        all_valid_ranges = false;
        return;
      }

      ranges.emplace_back(first, last);
    });
    return all_valid_ranges && !ranges.empty();
  }
  return false;
#ifdef CPPHTTPLIB_NO_EXCEPTIONS
}
#else
} catch (...) { return false; }